

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  Option *in_stack_000001d8;
  int in_stack_000001e0;
  int in_stack_000001e4;
  Mat *in_stack_000001e8;
  Mat *in_stack_000001f0;
  
  conv3x3s1_winograd43_transform_kernel_int8
            (in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001e0,
             in_stack_000001d8);
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_int8(kernel, AT, inch, outch, opt);
}